

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

size_t __thiscall
ddd::DaTrie<false,_true,_false>::edge_size_
          (DaTrie<false,_true,_false> *this,uint32_t node_pos,size_t upper)

{
  pointer pNVar1;
  pointer pNVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  pointer pNVar6;
  
  uVar4 = SUB84((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start[node_pos],0);
  if ((~uVar4 & 0x7fffffff) == 0 || (int)uVar4 < 0) {
    return 0;
  }
  pNVar2 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar5 = upper + (upper == 0);
  pNVar1 = pNVar2 + node_pos;
  sVar3 = 0;
  pNVar6 = pNVar1;
  do {
    if (sVar5 - 1 == sVar3) {
      return sVar5;
    }
    sVar3 = sVar3 + 1;
    pNVar6 = (pointer)&pNVar2[(uint)pNVar6->child ^ uVar4 & 0x7fffffff].sib;
  } while (*(uint8_t *)pNVar6 != pNVar1->child);
  return sVar3;
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }